

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O3

void __thiscall shaping_clipper::generate_hann_window(shaping_clipper *this)

{
  uint uVar1;
  ulong uVar2;
  float fVar3;
  double dVar4;
  
  uVar1 = this->max_oversample * this->size;
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      dVar4 = cos(((double)(int)uVar2 * 6.283185307179586) / (double)(int)uVar1);
      fVar3 = (float)((1.0 - dVar4) * 0.5);
      (this->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] = fVar3;
      dVar4 = (double)fVar3;
      (this->inv_window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] =
           (float)(double)(-(ulong)(0.1 < dVar4) & (ulong)(1.0 / dVar4));
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

void shaping_clipper::generate_hann_window() {
    double pi = acos(-1);
    int window_size = this->size * this->max_oversample;
    for (int i = 0; i < window_size; i++) {
        float value = 0.5 * (1 - cos(2 * pi * i / window_size));
        this->window[i] = value;
        // 1/window to calculate unwindowed peak.
        this->inv_window[i] = value > 0.1 ? 1.0 / value : 0;
    }
}